

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_change_sign(float *grbuf)

{
  int i;
  int b;
  float *grbuf_local;
  
  grbuf_local = grbuf + 0x12;
  for (b = 0; b < 0x20; b = b + 2) {
    for (i = 1; i < 0x12; i = i + 2) {
      grbuf_local[i] = -grbuf_local[i];
    }
    grbuf_local = grbuf_local + 0x24;
  }
  return;
}

Assistant:

static void drmp3_L3_change_sign(float *grbuf)
{
    int b, i;
    for (b = 0, grbuf += 18; b < 32; b += 2, grbuf += 36)
        for (i = 1; i < 18; i += 2)
            grbuf[i] = -grbuf[i];
}